

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O1

Vec_Int_t * Abc_SclFindCriticalNodeWindow(SC_Man *p,Vec_Int_t *vPathCos,int Window,int fDept)

{
  byte *pbVar1;
  ulong uVar2;
  float fVar3;
  int iVar4;
  Abc_Ntk_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  long *plVar7;
  void *pvVar8;
  uint uVar9;
  Vec_Int_t *vPath;
  int *piVar10;
  int iVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  
  iVar4 = p->vQue->nSize;
  if (iVar4 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x88,"int Vec_QueSize(Vec_Que_t *)");
  }
  uVar9 = 0xffffffff;
  if (iVar4 != 1) {
    uVar9 = p->vQue->pHeap[1];
  }
  if (-1 < (int)uVar9) {
    pAVar5 = p->pNtk;
    if ((int)uVar9 < pAVar5->vCos->nSize) {
      uVar9 = *(uint *)((long)pAVar5->vCos->pArray[uVar9] + 0x10);
      fVar13 = p->pTimes[uVar9].rise;
      fVar14 = p->pTimes[uVar9].fall;
      if (fVar13 <= fVar14) {
        fVar13 = fVar14;
      }
      vPath = (Vec_Int_t *)malloc(0x10);
      vPath->nCap = 100;
      vPath->nSize = 0;
      piVar10 = (int *)malloc(400);
      vPath->pArray = piVar10;
      if ((pAVar5->vTravIds).pArray == (int *)0x0) {
        iVar4 = pAVar5->vObjs->nSize;
        uVar2 = (long)iVar4 + 500;
        iVar11 = (int)uVar2;
        if ((pAVar5->vTravIds).nCap < iVar11) {
          piVar10 = (int *)malloc(uVar2 * 4);
          (pAVar5->vTravIds).pArray = piVar10;
          if (piVar10 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (pAVar5->vTravIds).nCap = iVar11;
        }
        if (-500 < iVar4) {
          memset((pAVar5->vTravIds).pArray,0,(uVar2 & 0xffffffff) << 2);
        }
        (pAVar5->vTravIds).nSize = iVar11;
      }
      iVar4 = pAVar5->nTravIds;
      pAVar5->nTravIds = iVar4 + 1;
      if (0x3ffffffe < iVar4) {
        __assert_fail("p->nTravIds < (1<<30)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
      }
      if (0 < vPathCos->nSize) {
        lVar12 = 0;
        do {
          iVar4 = vPathCos->pArray[lVar12];
          if (((long)iVar4 < 0) || (pVVar6 = p->pNtk->vObjs, pVVar6->nSize <= iVar4))
          goto LAB_00472ea5;
          plVar7 = (long *)pVVar6->pArray[iVar4];
          if (plVar7 != (long *)0x0) {
            fVar14 = p->pTimes[*(uint *)(plVar7 + 2)].rise;
            fVar3 = p->pTimes[*(uint *)(plVar7 + 2)].fall;
            if (fVar14 <= fVar3) {
              fVar14 = fVar3;
            }
            fVar14 = ((float)Window * fVar13) / 100.0 - (fVar13 - fVar14);
            if (0.0 <= fVar14) {
              Abc_SclFindCriticalNodeWindow_rec
                        (p,*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[4] * 8)
                         ,vPath,fVar14,fDept);
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < vPathCos->nSize);
      }
      if (0 < vPathCos->nSize) {
        lVar12 = 0;
        do {
          iVar4 = vPathCos->pArray[lVar12];
          if (((long)iVar4 < 0) || (pVVar6 = p->pNtk->vObjs, pVVar6->nSize <= iVar4))
          goto LAB_00472ea5;
          pvVar8 = pVVar6->pArray[iVar4];
          if (pvVar8 != (void *)0x0) {
            pbVar1 = (byte *)((long)pvVar8 + 0x14);
            *pbVar1 = *pbVar1 | 0x10;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < vPathCos->nSize);
      }
      iVar4 = vPath->nSize;
      if (0 < (long)iVar4) {
        piVar10 = vPath->pArray;
        lVar12 = 0;
        do {
          iVar11 = piVar10[lVar12];
          if (((long)iVar11 < 0) || (pVVar6 = p->pNtk->vObjs, pVVar6->nSize <= iVar11))
          goto LAB_00472ea5;
          pvVar8 = pVVar6->pArray[iVar11];
          if (pvVar8 != (void *)0x0) {
            pbVar1 = (byte *)((long)pvVar8 + 0x14);
            *pbVar1 = *pbVar1 | 0x10;
          }
          lVar12 = lVar12 + 1;
        } while (iVar4 != lVar12);
      }
      return vPath;
    }
  }
LAB_00472ea5:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Int_t * Abc_SclFindCriticalNodeWindow( SC_Man * p, Vec_Int_t * vPathCos, int Window, int fDept )
{
    float fMaxArr = Abc_SclReadMaxDelay( p );
    float fSlackMax = fMaxArr * Window / 100.0;
    Vec_Int_t * vPath = Vec_IntAlloc( 100 );
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkIncrementTravId( p->pNtk ); 
    Abc_NtkForEachObjVec( vPathCos, p->pNtk, pObj, i )
    {
        float fSlackThis = fSlackMax - (fMaxArr - Abc_SclObjTimeMax(p, pObj));
        if ( fSlackThis >= 0 )
            Abc_SclFindCriticalNodeWindow_rec( p, Abc_ObjFanin0(pObj), vPath, fSlackThis, fDept );
    }
    // label critical nodes
    Abc_NtkForEachObjVec( vPathCos, p->pNtk, pObj, i )
        pObj->fMarkA = 1;
    Abc_NtkForEachObjVec( vPath, p->pNtk, pObj, i )
        pObj->fMarkA = 1;
    return vPath;  
}